

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O2

bool anon_unknown.dwarf_1d7349::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *ph,int width,int height)

{
  bool bVar1;
  
  bVar1 = checkPixels<unsigned_int>(ph,0,width + -1,0,height + -1,width);
  return bVar1;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int width, int height)
{
    return checkPixels<T> (ph, 0, width - 1, 0, height - 1, width);
}